

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O2

string * miniros::names::clean(string *__return_storage_ptr__,string *name)

{
  ulong uVar1;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  while( true ) {
    uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x29141a);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar1);
  }
  if ((name->_M_string_length != 0) &&
     ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
      '/')) {
    std::__cxx11::string::erase
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length - 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string clean(const std::string& name)
{
  std::string clean = name;

  size_t pos = clean.find("//");
  while (pos != std::string::npos)
  {
    clean.erase(pos, 1);
    pos = clean.find("//", pos);
  }

  if (!name.empty() && *clean.rbegin() == '/')
  {
    clean.erase(clean.size() - 1, 1);
  }

  return clean;
}